

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect_four.h
# Opt level: O0

char __thiscall ConnectFourState::get_winner(ConnectFourState *this)

{
  const_reference pvVar1;
  const_reference pvVar2;
  long in_RDI;
  bool bVar3;
  int col_5;
  int row_5;
  int col_4;
  int row_4;
  int col_3;
  int row_3;
  int col_2;
  int row_2;
  int row_1;
  int row;
  int down;
  int up;
  int col_1;
  int col;
  int right;
  int left;
  value_type piece;
  int local_54;
  int local_50;
  int local_4c;
  int local_48;
  int local_44;
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  int local_30;
  int local_2c;
  int local_28;
  int local_24;
  int local_20;
  int local_1c;
  int local_18;
  char local_1;
  
  if (*(int *)(in_RDI + 0x28) < 0) {
    local_1 = '.';
  }
  else {
    pvVar1 = std::
             vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                           *)(in_RDI + 0x10),(long)*(int *)(in_RDI + 0x2c));
    pvVar2 = std::vector<char,_std::allocator<char>_>::operator[]
                       (pvVar1,(long)*(int *)(in_RDI + 0x28));
    local_1 = *pvVar2;
    local_18 = 0;
    local_1c = 0;
    local_20 = *(int *)(in_RDI + 0x28);
    while( true ) {
      local_20 = local_20 + -1;
      bVar3 = false;
      if (-1 < local_20) {
        pvVar1 = std::
                 vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                               *)(in_RDI + 0x10),(long)*(int *)(in_RDI + 0x2c));
        pvVar2 = std::vector<char,_std::allocator<char>_>::operator[](pvVar1,(long)local_20);
        bVar3 = *pvVar2 == local_1;
      }
      if (!bVar3) break;
      local_18 = local_18 + 1;
    }
    local_24 = *(int *)(in_RDI + 0x28);
    while( true ) {
      local_24 = local_24 + 1;
      bVar3 = false;
      if (local_24 < *(int *)(in_RDI + 8)) {
        pvVar1 = std::
                 vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                               *)(in_RDI + 0x10),(long)*(int *)(in_RDI + 0x2c));
        pvVar2 = std::vector<char,_std::allocator<char>_>::operator[](pvVar1,(long)local_24);
        bVar3 = *pvVar2 == local_1;
      }
      if (!bVar3) break;
      local_1c = local_1c + 1;
    }
    if (local_18 + 1 + local_1c < 4) {
      local_28 = 0;
      local_2c = 0;
      local_30 = *(int *)(in_RDI + 0x2c);
      while( true ) {
        local_30 = local_30 + -1;
        bVar3 = false;
        if (-1 < local_30) {
          pvVar1 = std::
                   vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                   ::operator[]((vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                                 *)(in_RDI + 0x10),(long)local_30);
          pvVar2 = std::vector<char,_std::allocator<char>_>::operator[]
                             (pvVar1,(long)*(int *)(in_RDI + 0x28));
          bVar3 = *pvVar2 == local_1;
        }
        if (!bVar3) break;
        local_28 = local_28 + 1;
      }
      local_34 = *(int *)(in_RDI + 0x2c);
      while( true ) {
        local_34 = local_34 + 1;
        bVar3 = false;
        if (local_34 < *(int *)(in_RDI + 4)) {
          pvVar1 = std::
                   vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                   ::operator[]((vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                                 *)(in_RDI + 0x10),(long)local_34);
          pvVar2 = std::vector<char,_std::allocator<char>_>::operator[]
                             (pvVar1,(long)*(int *)(in_RDI + 0x28));
          bVar3 = *pvVar2 == local_1;
        }
        if (!bVar3) break;
        local_2c = local_2c + 1;
      }
      if (local_28 + 1 + local_2c < 4) {
        local_28 = 0;
        local_2c = 0;
        local_38 = *(int *)(in_RDI + 0x2c);
        local_3c = *(int *)(in_RDI + 0x28);
        while( true ) {
          local_38 = local_38 + -1;
          local_3c = local_3c + -1;
          bVar3 = false;
          if ((-1 < local_38) && (bVar3 = false, -1 < local_3c)) {
            pvVar1 = std::
                     vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                     ::operator[]((vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                                   *)(in_RDI + 0x10),(long)local_38);
            pvVar2 = std::vector<char,_std::allocator<char>_>::operator[](pvVar1,(long)local_3c);
            bVar3 = *pvVar2 == local_1;
          }
          if (!bVar3) break;
          local_28 = local_28 + 1;
        }
        local_40 = *(int *)(in_RDI + 0x2c);
        local_44 = *(int *)(in_RDI + 0x28);
        while( true ) {
          local_40 = local_40 + 1;
          local_44 = local_44 + 1;
          bVar3 = false;
          if ((local_40 < *(int *)(in_RDI + 4)) && (bVar3 = false, local_44 < *(int *)(in_RDI + 8)))
          {
            pvVar1 = std::
                     vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                     ::operator[]((vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                                   *)(in_RDI + 0x10),(long)local_40);
            pvVar2 = std::vector<char,_std::allocator<char>_>::operator[](pvVar1,(long)local_44);
            bVar3 = *pvVar2 == local_1;
          }
          if (!bVar3) break;
          local_2c = local_2c + 1;
        }
        if (local_28 + 1 + local_2c < 4) {
          local_28 = 0;
          local_2c = 0;
          local_48 = *(int *)(in_RDI + 0x2c);
          local_4c = *(int *)(in_RDI + 0x28);
          while( true ) {
            local_48 = local_48 + 1;
            local_4c = local_4c + -1;
            bVar3 = false;
            if ((local_48 < *(int *)(in_RDI + 4)) && (bVar3 = false, -1 < local_4c)) {
              pvVar1 = std::
                       vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                       ::operator[]((vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                                     *)(in_RDI + 0x10),(long)local_48);
              pvVar2 = std::vector<char,_std::allocator<char>_>::operator[](pvVar1,(long)local_4c);
              bVar3 = *pvVar2 == local_1;
            }
            if (!bVar3) break;
            local_28 = local_28 + 1;
          }
          local_50 = *(int *)(in_RDI + 0x2c);
          local_54 = *(int *)(in_RDI + 0x28);
          while( true ) {
            local_50 = local_50 + -1;
            local_54 = local_54 + 1;
            bVar3 = false;
            if ((-1 < local_50) && (bVar3 = false, local_54 < *(int *)(in_RDI + 8))) {
              pvVar1 = std::
                       vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                       ::operator[]((vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                                     *)(in_RDI + 0x10),(long)local_50);
              pvVar2 = std::vector<char,_std::allocator<char>_>::operator[](pvVar1,(long)local_54);
              bVar3 = *pvVar2 == local_1;
            }
            if (!bVar3) break;
            local_2c = local_2c + 1;
          }
          if (local_28 + 1 + local_2c < 4) {
            local_1 = '.';
          }
        }
      }
    }
  }
  return local_1;
}

Assistant:

char get_winner() const
	{
		if (last_col < 0) {
			return player_markers[0];
		}

		// We only need to check around the last piece played.
		auto piece = board[last_row][last_col];

		// X X X X
		int left = 0, right = 0;
		for (int col = last_col - 1; col >= 0 && board[last_row][col] == piece; --col) left++;
		for (int col = last_col + 1; col < num_cols && board[last_row][col] == piece; ++col) right++;
		if (left + 1 + right >= 4) {
			return piece;
		}

		// X
		// X
		// X
		// X
		int up = 0, down = 0;
		for (int row = last_row - 1; row >= 0 && board[row][last_col] == piece; --row) up++;
		for (int row = last_row + 1; row < num_rows && board[row][last_col] == piece; ++row) down++;
		if (up + 1 + down >= 4) {
			return piece;
		}

		// X
		//  X
		//   X
		//    X
		up = 0;
		down = 0;
		for (int row = last_row - 1, col = last_col - 1; row >= 0 && col >= 0 && board[row][col] == piece; --row, --col) up++;
		for (int row = last_row + 1, col = last_col + 1; row < num_rows && col < num_cols && board[row][col] == piece; ++row, ++col) down++;
		if (up + 1 + down >= 4) {
			return piece;
		}

		//    X
		//   X
		//  X
		// X
		up = 0;
		down = 0;
		for (int row = last_row + 1, col = last_col - 1; row < num_rows && col >= 0 && board[row][col] == piece; ++row, --col) up++;
		for (int row = last_row - 1, col = last_col + 1; row >= 0 && col < num_cols && board[row][col] == piece; --row, ++col) down++;
		if (up + 1 + down >= 4) {
			return piece;
		}

		return player_markers[0];
	}